

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O1

void ExchCXX::detail::host_eval_exc_vxc_helper_unpolar<ExchCXX::BuiltinR2SCANL_X>
               (int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  double *vrho_00;
  double *vsigma_00;
  double *vtau_00;
  long lVar1;
  double dVar2;
  double sigma_00;
  double tau_00;
  double rho_00;
  double TAU;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  const_host_buffer_type local_68;
  const_host_buffer_type local_60;
  const_host_buffer_type local_58;
  host_buffer_type local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if (0 < N) {
    lVar1 = 0;
    local_68 = rho;
    local_60 = sigma;
    local_58 = lapl;
    local_50 = eps;
    do {
      local_40 = *(double *)((long)local_58 + lVar1);
      rho_00 = *(double *)((long)local_68 + lVar1);
      local_48 = *(double *)((long)local_60 + lVar1);
      if (rho_00 <= 1e-15) {
        local_98 = 0.0;
        local_78 = 0.0;
        local_80 = 0.0;
        local_88 = 0.0;
        local_38 = 0.0;
      }
      else {
        dVar2 = 1.0000000000000052e-40;
        if (1.0000000000000052e-40 <= local_48) {
          dVar2 = local_48;
        }
        local_70 = rho_00;
        kernel_traits<ExchCXX::BuiltinPC07OPT_K>::eval_exc_vxc_unpolar_impl
                  (rho_00,dVar2,local_40,0.0,&local_98,&local_78,&local_80,&local_88,&local_38);
        rho_00 = local_70;
      }
      vrho_00 = (double *)((long)vrho + lVar1);
      vsigma_00 = (double *)((long)vsigma + lVar1);
      vtau_00 = (double *)((long)vtau + lVar1);
      local_98 = local_98 * rho_00;
      if (rho_00 <= 1e-11) {
        *(double *)((long)local_50 + lVar1) = 0.0;
        *vrho_00 = 0.0;
        *vsigma_00 = 0.0;
        *vtau_00 = 0.0;
      }
      else {
        dVar2 = 4.641588833612795e-30;
        if (4.641588833612795e-30 <= local_48) {
          dVar2 = local_48;
        }
        tau_00 = 1e-20;
        if (1e-20 <= local_98) {
          tau_00 = local_98;
        }
        sigma_00 = rho_00 * 8.0 * tau_00;
        if (dVar2 <= sigma_00) {
          sigma_00 = dVar2;
        }
        kernel_traits<ExchCXX::BuiltinR2SCAN_X>::eval_exc_vxc_unpolar_impl
                  (rho_00,sigma_00,local_40,tau_00,(double *)((long)local_50 + lVar1),vrho_00,
                   vsigma_00,&local_90,vtau_00);
      }
      *vrho_00 = *vtau_00 * local_78 + *vrho_00;
      *vsigma_00 = *vtau_00 * local_80 + *vsigma_00;
      local_90 = *vtau_00 * local_88;
      *vtau_00 = 0.0;
      *(double *)((long)vlapl + lVar1) = local_90;
      lVar1 = lVar1 + 8;
    } while ((ulong)(uint)N << 3 != lVar1);
  }
  return;
}

Assistant:

MGGA_EXC_VXC_GENERATOR( host_eval_exc_vxc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    const auto lapl_i = traits::needs_laplacian ? lapl[i] : 0.0;
    double vl;
    traits::eval_exc_vxc_unpolar( rho[i], sigma[i], lapl_i, tau[i],
      eps[i], vrho[i], vsigma[i], vl, vtau[i] );
    if(traits::needs_laplacian) vlapl[i] = vl;

  }

}